

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_writer.h
# Opt level: O2

void __thiscall
xray_re::xr_writer::
w_seq<std::vector<xray_re::way_point_le,std::allocator<xray_re::way_point_le>>,write_point_le>
          (xr_writer *this,undefined8 *container)

{
  way_point_le *pwVar1;
  way_point_le *point;
  write_point_le local_21;
  
  pwVar1 = (way_point_le *)container[1];
  for (point = (way_point_le *)*container; point != pwVar1; point = point + 1) {
    write_point_le::operator()(&local_21,point,this);
  }
  return;
}

Assistant:

inline void xr_writer::w_seq(const T& container, F write)
{
	for (typename T::const_iterator it = container.begin(),
			end = container.end(); it != end; ++it) {
		write(*it, *this);
	}
}